

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale-test.cc
# Opt level: O1

void __thiscall LocaleTest_WFormat_Test::TestBody(LocaleTest_WFormat_Test *this)

{
  _Impl *p_Var1;
  bool bVar2;
  numpunct<wchar_t> *__f;
  char *pcVar3;
  basic_string_view<wchar_t> format_str;
  basic_string_view<wchar_t> format_str_00;
  basic_string_view<wchar_t> format_str_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args_01;
  AssertionResult gtest_ar;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_int>
  as;
  locale loc;
  undefined1 local_60 [32];
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  locale local_30;
  AssertHelper local_28 [2];
  locale local_18;
  
  std::locale::locale((locale *)local_60);
  __f = (numpunct<wchar_t> *)operator_new(0x18);
  *(undefined8 *)__f = 0;
  *(undefined8 *)&__f->field_0x8 = 0;
  *(undefined8 *)&__f->field_0x10 = 0;
  std::__cxx11::numpunct<wchar_t>::numpunct((ulong)__f);
  *(undefined ***)__f = &PTR__numpunct_00177f90;
  std::locale::locale<numpunct<wchar_t>>(&local_18,(locale *)local_60,__f);
  std::locale::~locale((locale *)local_60);
  std::locale::locale(&local_30);
  local_28[0].data_ = (AssertHelperData *)0x12d687;
  format_str.size_ = 4;
  format_str.data_ = L"{:n}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_28;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
                ::TYPES;
  fmt::v5::internal::vformat<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_60,
             &local_30,format_str,args);
  testing::internal::CmpHelperEQ<wchar_t[10],std::__cxx11::wstring>
            (local_40,"L\"1,234,567\"","fmt::format(std::locale(), L\"{:n}\", 1234567)",
             (wchar_t (*) [10])L"1,234,567",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_60)
  ;
  p_Var1 = (_Impl *)(local_60 + 0x10);
  if ((_Impl *)local_60._0_8_ != p_Var1) {
    operator_delete((void *)local_60._0_8_);
  }
  std::locale::~locale(&local_30);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(local_28,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(local_28);
    if ((_Impl *)local_60._0_8_ != (_Impl *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((_Impl *)local_60._0_8_ != (_Impl *)0x0)) {
        (**(code **)(*(long *)local_60._0_8_ + 8))();
      }
      local_60._0_8_ = (_Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28[0].data_ = (AssertHelperData *)0x12d687;
  format_str_00.size_ = 4;
  format_str_00.data_ = L"{:n}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_28;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
       ::TYPES;
  fmt::v5::internal::vformat<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_60,
             &local_18,format_str_00,args_00);
  testing::internal::CmpHelperEQ<wchar_t[10],std::__cxx11::wstring>
            (local_40,"L\"1~234~567\"","fmt::format(loc, L\"{:n}\", 1234567)",
             (wchar_t (*) [10])L"1~234~567",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_60)
  ;
  if ((_Impl *)local_60._0_8_ != p_Var1) {
    operator_delete((void *)local_60._0_8_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(local_28,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper(local_28);
    if ((_Impl *)local_60._0_8_ != (_Impl *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((_Impl *)local_60._0_8_ != (_Impl *)0x0)) {
        (**(code **)(*(long *)local_60._0_8_ + 8))();
      }
      local_60._0_8_ = (_Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28[0].data_ = (AssertHelperData *)0x12d687;
  format_str_01.size_ = 4;
  format_str_01.data_ = L"{:n}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)local_28;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
       ::TYPES;
  fmt::v5::internal::vformat<wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_60,
             &local_18,format_str_01,args_01);
  testing::internal::CmpHelperEQ<wchar_t[10],std::__cxx11::wstring>
            (local_40,"L\"1~234~567\"","fmt::vformat(loc, L\"{:n}\", fmt::wformat_args(as))",
             (wchar_t (*) [10])L"1~234~567",
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_60)
  ;
  if ((_Impl *)local_60._0_8_ != p_Var1) {
    operator_delete((void *)local_60._0_8_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_60);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x21,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    if ((_Impl *)local_60._0_8_ != (_Impl *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((_Impl *)local_60._0_8_ != (_Impl *)0x0)) {
        (**(code **)(*(long *)local_60._0_8_ + 8))();
      }
      local_60._0_8_ = (_Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::locale::~locale(&local_18);
  return;
}

Assistant:

TEST(LocaleTest, WFormat) {
  std::locale loc(std::locale(), new numpunct<wchar_t>());
  EXPECT_EQ(L"1,234,567", fmt::format(std::locale(), L"{:n}", 1234567));
  EXPECT_EQ(L"1~234~567", fmt::format(loc, L"{:n}", 1234567));
  fmt::format_arg_store<fmt::wformat_context, int> as{1234567};
  EXPECT_EQ(L"1~234~567", fmt::vformat(loc, L"{:n}", fmt::wformat_args(as)));
}